

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

bool QMetaObjectPrivate::disconnect
               (QObject *sender,int signal_index,QMetaObject *smeta,QObject *receiver,
               int method_index,void **slot,DisconnectType disconnectType)

{
  QBasicMutex *this;
  __pointer_type pQVar1;
  totally_ordered_wrapper<QObjectPrivate::ConnectionData_*> connections;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  char *pcVar6;
  __sighandler_t p_Var7;
  ulong uVar8;
  undefined8 extraout_RDX;
  int sig_index;
  long in_FS_OFFSET;
  bool bVar9;
  QString local_a8;
  QByteArray local_90;
  QString local_78;
  QMessageLogger local_60;
  QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sender != (QObject *)0x0) {
    uVar8 = (ulong)((int)sender + (int)(((ulong)sender & 0xffffffff) / 0x418) * -0x418 & 0x7f8);
    this = (QBasicMutex *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar8);
    if (*(long *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar8) == 0) {
      LOCK();
      bVar9 = (this->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar9) {
        (this->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (!bVar9) goto LAB_002b3d10;
    }
    else {
LAB_002b3d10:
      QBasicMutex::lockInternal(this);
    }
    connections.ptr = (ConnectionData *)(sender->d_ptr).d[1].parent;
    if (connections.ptr == (ConnectionData *)0x0) {
      bVar9 = false;
      LOCK();
      pQVar1 = (this->d_ptr)._q_value._M_b._M_p;
      (this->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if (pQVar1 == (__pointer_type)0x1) goto LAB_002b3fd3;
      QBasicMutex::unlockInternalFutex(this,pQVar1);
    }
    else {
      LOCK();
      ((connections.ptr)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           ((connections.ptr)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_40.d.ptr =
           (totally_ordered_wrapper<QObjectPrivate::ConnectionData_*>)
           (totally_ordered_wrapper<QObjectPrivate::ConnectionData_*>)connections.ptr;
      if (signal_index < 0) {
        if ((method_index < 0 && receiver == (QObject *)0x0) &&
           (bVar9 = QObjectPrivate::isSignalConnected((QObjectPrivate *)(sender->d_ptr).d,0,true),
           bVar9)) {
          local_60.context.version = 2;
          local_60.context.line = 0;
          local_60.context.file._0_4_ = 0;
          local_60.context.file._4_4_ = 0;
          local_60.context.function._0_4_ = 0;
          local_60.context.function._4_4_ = 0;
          local_60.context.category = "default";
          iVar3 = (**sender->_vptr_QObject)(sender);
          pcVar5 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar3));
          QObject::objectName(&local_78,sender);
          if (local_78.d.size == 0) {
            pcVar6 = "unnamed";
          }
          else {
            QObject::objectName(&local_a8,sender);
            QString::toLocal8Bit_helper(&local_90,(QChar *)local_a8.d.ptr,local_a8.d.size);
            pcVar6 = QByteArray::data(&local_90);
          }
          QMessageLogger::warning
                    (&local_60,
                     "QObject::disconnect: wildcard call disconnects from destroyed signal of %s::%s"
                     ,pcVar5,pcVar6);
          if (local_78.d.size != 0) {
            if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
              }
            }
            if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        iVar3 = -1;
        bVar9 = false;
        while( true ) {
          iVar4 = -1;
          if (((connections.ptr)->signalVector).
              super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b._M_p !=
              (__pointer_type)0x0) {
            iVar4 = (int)(((connections.ptr)->signalVector).
                          super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b._M_p
                         )->allocated;
          }
          if (iVar4 <= iVar3) break;
          bVar2 = disconnectHelper((ConnectionData *)local_40.d.ptr,iVar3,receiver,method_index,slot
                                   ,this,disconnectType);
          bVar9 = (bool)(bVar9 | bVar2);
          iVar3 = iVar3 + 1;
        }
      }
      else {
        if (((connections.ptr)->signalVector).
            super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b._M_p ==
            (__pointer_type)0x0) {
          iVar3 = -1;
        }
        else {
          iVar3 = (int)(((connections.ptr)->signalVector).
                        super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b._M_p)
                       ->allocated;
        }
        if (signal_index < iVar3) {
          bVar9 = disconnectHelper(connections.ptr,signal_index,receiver,method_index,slot,this,
                                   disconnectType);
        }
        else {
          bVar9 = false;
        }
      }
      QExplicitlySharedDataPointer<QObjectPrivate::ConnectionData>::~QExplicitlySharedDataPointer
                (&local_40);
      LOCK();
      pQVar1 = (this->d_ptr)._q_value._M_b._M_p;
      (this->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if (pQVar1 != (__pointer_type)0x1) {
        QBasicMutex::unlockInternalFutex(this,pQVar1);
      }
      if (bVar9 != false) {
        if ((((connections.ptr)->orphaned)._M_i.c != 0) &&
           (((connections.ptr)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
            _q_value.super___atomic_base<int>._M_i == 1)) {
          QObjectPrivate::ConnectionData::cleanOrphanedConnectionsImpl
                    (connections.ptr,sender,NeedToLock);
        }
        p_Var7 = signal((int)smeta,(__sighandler_t)(ulong)(uint)signal_index);
        local_60.context.version = (int)p_Var7;
        local_60.context.line = (int)((ulong)p_Var7 >> 0x20);
        local_60.context.file._0_4_ = (undefined4)extraout_RDX;
        local_60.context.file._4_4_ = (undefined4)((ulong)extraout_RDX >> 0x20);
        if (p_Var7 != (__sighandler_t)0x0) {
          (*sender->_vptr_QObject[0xb])(sender,&local_60);
        }
        bVar9 = true;
        goto LAB_002b3fd3;
      }
    }
  }
  bVar9 = false;
LAB_002b3fd3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool QMetaObjectPrivate::disconnect(const QObject *sender,
                                    int signal_index, const QMetaObject *smeta,
                                    const QObject *receiver, int method_index, void **slot,
                                    DisconnectType disconnectType)
{
    if (!sender)
        return false;

    QObject *s = const_cast<QObject *>(sender);

    QBasicMutex *senderMutex = signalSlotLock(sender);
    QMutexLocker locker(senderMutex);

    QObjectPrivate::ConnectionData *scd = QObjectPrivate::get(s)->connections.loadRelaxed();
    if (!scd)
        return false;

    bool success = false;
    {
        // prevent incoming connections changing the connections->receivers while unlocked
        QObjectPrivate::ConnectionDataPointer connections(scd);

        if (signal_index < 0) {
            // wildcard disconnect - warn if this disconnects destroyed()
            if (!receiver && method_index < 0 && sender->d_func()->isSignalConnected(0)) {
                qWarning("QObject::disconnect: wildcard call disconnects from destroyed signal of"
                         " %s::%s", sender->metaObject()->className(),
                                    sender->objectName().isEmpty()
                                        ? "unnamed"
                                        : sender->objectName().toLocal8Bit().data());
            }
            // remove from all connection lists
            for (int sig_index = -1; sig_index < scd->signalVectorCount(); ++sig_index) {
                if (disconnectHelper(connections.data(), sig_index, receiver, method_index, slot, senderMutex, disconnectType))
                    success = true;
            }
        } else if (signal_index < scd->signalVectorCount()) {
            if (disconnectHelper(connections.data(), signal_index, receiver, method_index, slot, senderMutex, disconnectType))
                success = true;
        }
    }

    locker.unlock();
    if (success) {
        scd->cleanOrphanedConnections(s);

        QMetaMethod smethod = QMetaObjectPrivate::signal(smeta, signal_index);
        if (smethod.isValid())
            s->disconnectNotify(smethod);
    }

    return success;
}